

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiID ImGui::GetColumnsID(char *str_id,int columns_count)

{
  ImGuiID IVar1;
  ImGuiWindow *this;
  char *local_38;
  int local_28;
  ImGuiID id;
  ImGuiWindow *window;
  int columns_count_local;
  char *str_id_local;
  
  this = GetCurrentWindow();
  local_28 = columns_count;
  if (str_id != (char *)0x0) {
    local_28 = 0;
  }
  PushID(local_28 + 0x11223347);
  local_38 = str_id;
  if (str_id == (char *)0x0) {
    local_38 = "columns";
  }
  IVar1 = ImGuiWindow::GetID(this,local_38,(char *)0x0);
  PopID();
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetColumnsID(const char* str_id, int columns_count)
{
    ImGuiWindow* window = GetCurrentWindow();

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    return id;
}